

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O1

void __thiscall
string_to_float_check_Test::~string_to_float_check_Test(string_to_float_check_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(string, to_float_check)
{
    ST::conversion_result result;
    (void) ST_LITERAL("0").to_float(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST_LITERAL("0").to_double(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());

    (void) ST_LITERAL("16").to_float(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST_LITERAL("+16").to_float(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST_LITERAL("-16").to_float(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST_LITERAL("16").to_double(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST_LITERAL("+16").to_double(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST_LITERAL("-16").to_double(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());

    (void) ST_LITERAL("16.0").to_float(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST_LITERAL("+16.0").to_float(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST_LITERAL("-16.0").to_float(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST_LITERAL("16.0").to_double(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST_LITERAL("+16.0").to_double(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST_LITERAL("-16.0").to_double(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());

    (void) ST_LITERAL("1.6e1").to_float(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST_LITERAL("+1.6e1").to_float(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST_LITERAL("-1.6e1").to_float(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST_LITERAL("1.6e1").to_double(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST_LITERAL("+1.6e1").to_double(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST_LITERAL("-1.6e1").to_double(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());

    (void) ST_LITERAL("16xx").to_float(result);
    EXPECT_TRUE(result.ok());
    EXPECT_FALSE(result.full_match());
    (void) ST_LITERAL("16xx").to_double(result);
    EXPECT_TRUE(result.ok());
    EXPECT_FALSE(result.full_match());
    (void) ST_LITERAL("xx").to_float(result);
    EXPECT_FALSE(result.ok());
    EXPECT_FALSE(result.full_match());
    (void) ST_LITERAL("xx").to_double(result);
    EXPECT_FALSE(result.ok());
    EXPECT_FALSE(result.full_match());

    (void) ST::string().to_float(result);
    EXPECT_FALSE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST::string().to_double(result);
    EXPECT_FALSE(result.ok());
    EXPECT_TRUE(result.full_match());
}